

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void __thiscall MPLSParser::composePlayListMark(MPLSParser *this,BitStreamWriter *writer)

{
  uint32_t *puVar1;
  bool bVar2;
  int iVar3;
  uint value;
  uint32_t uVar4;
  uint8_t *puVar5;
  size_type sVar6;
  reference pPVar7;
  PlayListMark *i_1;
  iterator __end1;
  iterator __begin1;
  vector<PlayListMark,_std::allocator<PlayListMark>_> *__range1;
  uint local_38 [2];
  uint32_t i;
  MPLSStreamInfo *streamInfo;
  uint32_t *puStack_20;
  int beforeCount;
  uint32_t *lengthPos;
  BitStreamWriter *writer_local;
  MPLSParser *this_local;
  
  lengthPos = (uint32_t *)writer;
  writer_local = (BitStreamWriter *)this;
  puVar5 = BitStream::getBuffer(&writer->super_BitStream);
  iVar3 = BitStreamWriter::getBitsCount((BitStreamWriter *)lengthPos);
  puStack_20 = (uint32_t *)(puVar5 + iVar3 / 8);
  BitStreamWriter::putBits((BitStreamWriter *)lengthPos,0x20,0);
  iVar3 = BitStreamWriter::getBitsCount((BitStreamWriter *)lengthPos);
  streamInfo._4_4_ = iVar3 / 8;
  _i = getMainStream(this);
  bVar2 = std::vector<PlayListMark,_std::allocator<PlayListMark>_>::empty(&this->m_marks);
  if (bVar2) {
    if (this->m_chapterLen == 0) {
      local_38[1] = 0xffffffff;
      std::vector<PlayListMark,std::allocator<PlayListMark>>::emplace_back<int,unsigned_int&>
                ((vector<PlayListMark,std::allocator<PlayListMark>> *)&this->m_marks,
                 (int *)(local_38 + 1),&this->IN_time);
    }
    else {
      for (local_38[0] = this->IN_time; local_38[0] < this->OUT_time;
          local_38[0] = this->m_chapterLen * 45000 + local_38[0]) {
        __range1._4_4_ = 0xffffffff;
        std::vector<PlayListMark,std::allocator<PlayListMark>>::emplace_back<int,unsigned_int&>
                  ((vector<PlayListMark,std::allocator<PlayListMark>> *)&this->m_marks,
                   (int *)((long)&__range1 + 4),local_38);
      }
    }
  }
  puVar1 = lengthPos;
  sVar6 = std::vector<PlayListMark,_std::allocator<PlayListMark>_>::size(&this->m_marks);
  BitStreamWriter::putBits((BitStreamWriter *)puVar1,0x10,(uint)sVar6);
  __end1 = std::vector<PlayListMark,_std::allocator<PlayListMark>_>::begin(&this->m_marks);
  i_1 = (PlayListMark *)
        std::vector<PlayListMark,_std::allocator<PlayListMark>_>::end(&this->m_marks);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<PlayListMark_*,_std::vector<PlayListMark,_std::allocator<PlayListMark>_>_>
                                     *)&i_1), bVar2) {
    pPVar7 = __gnu_cxx::
             __normal_iterator<PlayListMark_*,_std::vector<PlayListMark,_std::allocator<PlayListMark>_>_>
             ::operator*(&__end1);
    BitStreamWriter::putBits((BitStreamWriter *)lengthPos,8,0);
    BitStreamWriter::putBits((BitStreamWriter *)lengthPos,8,1);
    puVar1 = lengthPos;
    if (pPVar7->m_playItemID < 0) {
      value = calcPlayItemID(_i,pPVar7->m_markTime << 1);
      BitStreamWriter::putBits((BitStreamWriter *)puVar1,0x10,value);
    }
    else {
      BitStreamWriter::putBits((BitStreamWriter *)lengthPos,0x10,pPVar7->m_playItemID);
    }
    BitStreamWriter::putBits((BitStreamWriter *)lengthPos,0x20,pPVar7->m_markTime);
    BitStreamWriter::putBits((BitStreamWriter *)lengthPos,0x10,0xffff);
    BitStreamWriter::putBits((BitStreamWriter *)lengthPos,0x20,0);
    __gnu_cxx::
    __normal_iterator<PlayListMark_*,_std::vector<PlayListMark,_std::allocator<PlayListMark>_>_>::
    operator++(&__end1);
  }
  iVar3 = BitStreamWriter::getBitsCount((BitStreamWriter *)lengthPos);
  uVar4 = my_ntohl(iVar3 / 8 - streamInfo._4_4_);
  *puStack_20 = uVar4;
  return;
}

Assistant:

void MPLSParser::composePlayListMark(BitStreamWriter& writer)
{
    const auto lengthPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // length
    const int beforeCount = writer.getBitsCount() / 8;
    const MPLSStreamInfo& streamInfo = getMainStream();
    if (m_marks.empty())
    {
        if (m_chapterLen == 0)
            m_marks.emplace_back(-1, IN_time);
        else
        {
            for (uint32_t i = IN_time; i < OUT_time; i += m_chapterLen * 45000) m_marks.emplace_back(-1, i);
        }
    }
    writer.putBits(16, static_cast<unsigned>(m_marks.size()));
    for (const auto& i : m_marks)
    {
        writer.putBits(8, 0);  // reserved_for_future_use
        writer.putBits(8, 1);  // mark_type 0x01 = Chapter search
        if (i.m_playItemID >= 0)
            writer.putBits(16, i.m_playItemID);  // play item ID
        else
            writer.putBits(16, calcPlayItemID(streamInfo, i.m_markTime * 2));  // play item ID
        writer.putBits(32, i.m_markTime);
        writer.putBits(16, 0xffff);  // entry_ES_PID always 0xffff for mark_type 1
        writer.putBits(32, 0);       // duration always 0 for mark_type 1
    }
    *lengthPos = my_htonl(writer.getBitsCount() / 8 - beforeCount);
}